

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

char * fmt_node(adh_node_t *node)

{
  char *pcVar1;
  adh_node_t *node_local;
  
  if (node == (adh_node_t *)0x0) {
    snprintf(fmt_node::str,100," ");
  }
  else {
    pcVar1 = fmt_symbol(node->symbol);
    snprintf(fmt_node::str,100,"%s (%3u,%6u)",pcVar1,(ulong)node->order,(ulong)node->weight);
  }
  return fmt_node::str;
}

Assistant:

char * fmt_node(const adh_node_t* node) {
    static char str[MAX_SYMBOL_STR] = {0};
    if(node)
        snprintf(str, sizeof(str), "%s (%3u,%6u)", fmt_symbol(node->symbol), node->order, node->weight);
    else
        snprintf(str, sizeof(str), " ");

    return str;
}